

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_utility.cpp
# Opt level: O2

void FCanvasTextureInfo::UpdateAll(void)

{
  FCanvasTexture *pFVar1;
  FRenderer *pFVar2;
  AActor *pAVar3;
  FCanvasTextureInfo **ppFVar4;
  
  ppFVar4 = &List;
  while (ppFVar4 = &((FCanvasTextureInfo *)ppFVar4)->Next->Next,
        (FCanvasTextureInfo *)ppFVar4 != (FCanvasTextureInfo *)0x0) {
    pAVar3 = GC::ReadBarrier<AActor>((AActor **)&((FCanvasTextureInfo *)ppFVar4)->Viewpoint);
    pFVar2 = Renderer;
    if ((pAVar3 != (AActor *)0x0) &&
       (pFVar1 = ((FCanvasTextureInfo *)ppFVar4)->Texture, pFVar1->bNeedsUpdate == true)) {
      pAVar3 = GC::ReadBarrier<AActor>((AActor **)&((FCanvasTextureInfo *)ppFVar4)->Viewpoint);
      (*pFVar2->_vptr_FRenderer[0x13])
                (pFVar2,pFVar1,pAVar3,(ulong)(uint)((FCanvasTextureInfo *)ppFVar4)->FOV);
    }
  }
  return;
}

Assistant:

void FCanvasTextureInfo::UpdateAll ()
{
	FCanvasTextureInfo *probe;

	for (probe = List; probe != NULL; probe = probe->Next)
	{
		if (probe->Viewpoint != NULL && probe->Texture->bNeedsUpdate)
		{
			Renderer->RenderTextureView(probe->Texture, probe->Viewpoint, probe->FOV);
		}
	}
}